

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

uint32_t av1_get_crc32c_value_c(void *c,uint8_t *buf,size_t len)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  uint8_t *next;
  
  uVar2 = 0xffffffff;
  if (((ulong)buf & 7) != 0 && len != 0) {
    puVar1 = buf + 1;
    sVar4 = len;
    do {
      uVar3 = *(ulong *)buf;
      buf = (uint8_t *)((long)buf + 1);
      uVar2 = uVar2 >> 8 ^ (ulong)*(uint *)((long)c + (ulong)(byte)((byte)uVar3 ^ (byte)uVar2) * 4);
      len = sVar4 - 1;
      if (sVar4 == 1) break;
      uVar3 = (ulong)puVar1 & 7;
      puVar1 = puVar1 + 1;
      sVar4 = len;
    } while (uVar3 != 0);
  }
  for (; 7 < len; len = len - 8) {
    uVar3 = *(ulong *)buf;
    uVar2 = uVar2 ^ uVar3;
    uVar2 = (ulong)(*(uint *)((long)c + (ulong)((uint)(uVar2 >> 8) & 0xff) * 4 + 0x1800) ^
                    *(uint *)((long)c + (ulong)((uint)uVar2 & 0xff) * 4 + 0x1c00) ^
                    *(uint *)((long)c + (ulong)((uint)(uVar2 >> 0xe) & 0x3fc) + 0x1400) ^
                    *(uint *)((long)c + (uVar2 >> 0x18 & 0xff) * 4 + 0x1000) ^
                    *(uint *)((long)c + (uVar2 >> 0x1e & 0x3fc) + 0xc00) ^
                    *(uint *)((long)c + (uVar3 >> 0x26 & 0x3fc) + 0x800) ^
                    *(uint *)((long)c + (uVar3 >> 0x2e & 0x3fc) + 0x400) ^
                   *(uint *)((long)c + (uVar3 >> 0x38) * 4));
    buf = (uint8_t *)((long)buf + 8);
  }
  if (len != 0) {
    uVar3 = 0;
    do {
      uVar2 = uVar2 >> 8 ^
              (ulong)*(uint *)((long)c +
                              (ulong)(byte)(*(byte *)((long)buf + uVar3) ^ (byte)uVar2) * 4);
      uVar3 = uVar3 + 1;
    } while (len != uVar3);
  }
  return ~(uint)uVar2;
}

Assistant:

uint32_t av1_get_crc32c_value_c(void *c, uint8_t *buf, size_t len) {
  const uint8_t *next = (const uint8_t *)(buf);
  uint64_t crc;
  CRC32C *p = (CRC32C *)c;
  crc = 0 ^ 0xffffffff;
  while (len && ((uintptr_t)next & 7) != 0) {
    crc = p->table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
    len--;
  }
  while (len >= 8) {
    crc ^= *(uint64_t *)next;
    crc = p->table[7][crc & 0xff] ^ p->table[6][(crc >> 8) & 0xff] ^
          p->table[5][(crc >> 16) & 0xff] ^ p->table[4][(crc >> 24) & 0xff] ^
          p->table[3][(crc >> 32) & 0xff] ^ p->table[2][(crc >> 40) & 0xff] ^
          p->table[1][(crc >> 48) & 0xff] ^ p->table[0][crc >> 56];
    next += 8;
    len -= 8;
  }
  while (len) {
    crc = p->table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
    len--;
  }
  return (uint32_t)crc ^ 0xffffffff;
}